

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cpp
# Opt level: O1

void __thiscall
r_exec::_Fact::_Fact
          (_Fact *this,uint16_t opcode,Code *object,uint64_t after,uint64_t before,double confidence
          ,double psln_thr)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  Atom local_3c [4];
  double local_38;
  double local_30;
  
  local_38 = psln_thr;
  local_30 = confidence;
  r_code::Code::Code((Code *)this);
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject._references.
  m_vector.super__Vector_base<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject._references.
  m_vector.super__Vector_base<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject._code.m_vector.
  super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject._references.
  m_vector.super__Vector_base<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject._code.m_vector.
  super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject._code.m_vector.
  super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.hash_value = 0;
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.invalidated = 0;
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.m_pslnThrMutex.
  super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)
   ((long)&(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.m_pslnThrMutex.
           super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)
   ((long)&(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.m_pslnThrMutex.
           super___mutex_base._M_mutex + 0x10) = 0;
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.m_pslnThrMutex.
  super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.m_pslnThrMutex.
  super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.m_viewsMutex.
  super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)
   ((long)&(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.m_viewsMutex.
           super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)
   ((long)&(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.m_viewsMutex.
           super___mutex_base._M_mutex + 0x10) = 0;
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.m_viewsMutex.
  super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.m_viewsMutex.
  super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.m_markersMutex.
  super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)
   ((long)&(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.m_markersMutex.
           super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)
   ((long)&(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.m_markersMutex.
           super___mutex_base._M_mutex + 0x10) = 0;
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.m_markersMutex.
  super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.m_markersMutex.
  super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject._oid =
       0xffffffff;
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
  super__Object._vptr__Object = (_func_int **)&PTR__Object_001bed08;
  r_code::Atom::Object((ushort)local_3c,(uchar)opcode);
  iVar1 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[4])(this,0);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var,iVar1),local_3c);
  r_code::Atom::~Atom(local_3c);
  r_code::Atom::RPointer((ushort)local_3c);
  iVar1 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[4])(this,1);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_00,iVar1),local_3c);
  r_code::Atom::~Atom(local_3c);
  r_code::Atom::IPointer((ushort)local_3c);
  iVar1 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[4])(this,2);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_01,iVar1),local_3c);
  r_code::Atom::~Atom(local_3c);
  r_code::Atom::IPointer((ushort)local_3c);
  iVar1 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[4])(this,3);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_02,iVar1),local_3c);
  r_code::Atom::~Atom(local_3c);
  r_code::Atom::Float((float)local_30);
  iVar1 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[4])(this,4);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_03,iVar1),local_3c);
  r_code::Atom::~Atom(local_3c);
  r_code::Atom::Float((float)local_38);
  iVar1 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[4])(this,5);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_04,iVar1),local_3c);
  r_code::Atom::~Atom(local_3c);
  r_code::Utils::SetIndirectTimestamp<r_code::Code>((Code *)this,2,after);
  r_code::Utils::SetIndirectTimestamp<r_code::Code>((Code *)this,3,before);
  (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
    super__Object._vptr__Object[0x19])(this,object);
  return;
}

Assistant:

_Fact::_Fact(uint16_t opcode, Code *object, uint64_t after, uint64_t before, double confidence, double psln_thr): LObject()
{
    code(0) = Atom::Object(opcode, FACT_ARITY);
    code(FACT_OBJ) = Atom::RPointer(0);
    code(FACT_AFTER) = Atom::IPointer(FACT_ARITY + 1);
    code(FACT_BEFORE) = Atom::IPointer(FACT_ARITY + 4);
    code(FACT_CFD) = Atom::Float(confidence);
    code(FACT_ARITY) = Atom::Float(psln_thr);
    Utils::SetIndirectTimestamp<Code>(this, FACT_AFTER, after);
    Utils::SetIndirectTimestamp<Code>(this, FACT_BEFORE, before);
    add_reference(object);
}